

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void pnga_norm1(Integer g_a,double *nm)

{
  float fVar1;
  double dVar2;
  int iVar3;
  double dVar4;
  int iVar5;
  Integer icode;
  Integer IVar6;
  Integer icode_00;
  Integer IVar7;
  Integer IVar8;
  int iVar9;
  long lVar10;
  double *pdVar11;
  long lVar12;
  double dVar13;
  double *pdVar14;
  long lVar15;
  double *pdVar16;
  float *pfVar17;
  double *pdVar18;
  int *piVar19;
  long *plVar20;
  float *pfVar21;
  double *pdVar22;
  long lVar23;
  long lVar24;
  double *pdVar25;
  double *pdVar26;
  int iVar27;
  double *pdVar28;
  bool bVar29;
  uint uVar30;
  ulong uVar31;
  float fVar32;
  float fsum;
  int isum;
  double *local_3f0;
  long local_3e8;
  Integer type;
  float local_3d8 [2];
  double dsum;
  long lsum;
  char *ptr;
  double local_3b8 [2];
  double *local_3a8;
  double dval;
  Integer ld;
  Integer ndim;
  Integer hi [2];
  Integer lo [2];
  Integer dims [7];
  _iterator_hdl hdl;
  
  type = 0;
  local_3f0 = nm;
  pnga_nodeid();
  pnga_nnodes();
  iVar5 = _ga_sync_end;
  isum = 0;
  lsum = 0;
  dsum = 0.0;
  fsum = 0.0;
  ptr = (char *)0x0;
  local_3b8[0] = 0.0;
  local_3b8[1] = 0.0;
  local_3d8[0] = 0.0;
  _ga_sync_end = 1;
  bVar29 = _ga_sync_begin != 0;
  _ga_sync_begin = _ga_sync_end;
  if (bVar29) {
    pnga_sync();
  }
  pnga_check_handle(g_a,"ga_norm1_");
  pnga_inquire(g_a,&type,&ndim,dims);
  if (ndim - 3U < 0xfffffffffffffffe) {
    pnga_error("ga_norm1: wrong dimension",ndim);
  }
  switch(type) {
  case 0x3e9:
    local_3a8 = (double *)&isum;
    break;
  case 0x3ea:
    local_3a8 = (double *)&lsum;
    break;
  case 0x3eb:
    local_3a8 = (double *)&fsum;
    break;
  case 0x3ec:
    local_3a8 = &dsum;
    break;
  default:
    pnga_error("ga_norm1_: wrong data type:",type);
    local_3a8 = (double *)0x0;
    break;
  case 0x3ee:
    local_3a8 = (double *)local_3d8;
    break;
  case 0x3ef:
    local_3a8 = local_3b8;
  }
  pnga_local_iterator_init(g_a,&hdl);
  pdVar28 = local_3a8;
  while (iVar9 = pnga_local_iterator_next(&hdl,lo,hi,&ptr,&ld), icode_00 = ndim, IVar6 = ld,
        pdVar16 = (double *)ptr, icode = type, iVar9 != 0) {
    lVar10 = type + -0x3e9;
    switch(lVar10) {
    case 0:
      pdVar11 = (double *)0x0;
      pdVar14 = (double *)0x0;
      pdVar18 = (double *)0x0;
      pdVar22 = (double *)0x0;
      pdVar25 = (double *)0x0;
      pdVar26 = pdVar28;
      goto LAB_001667fa;
    case 1:
      pdVar11 = (double *)0x0;
      pdVar14 = (double *)0x0;
      pdVar18 = (double *)0x0;
      pdVar22 = (double *)0x0;
      pdVar25 = pdVar28;
      goto LAB_001667f7;
    case 2:
      pdVar11 = (double *)0x0;
      pdVar14 = (double *)0x0;
      pdVar18 = pdVar28;
      goto LAB_001667f2;
    case 3:
      pdVar11 = (double *)0x0;
      pdVar14 = (double *)0x0;
      pdVar18 = (double *)0x0;
      pdVar22 = pdVar28;
      goto LAB_001667f4;
    default:
      pnga_error("ga1_norm1_block: wrong data type:",type);
      pdVar11 = (double *)0x0;
      break;
    case 5:
      pdVar11 = pdVar28;
      break;
    case 6:
      pdVar11 = (double *)0x0;
      pdVar14 = pdVar28;
      goto LAB_001667f0;
    }
    pdVar14 = (double *)0x0;
LAB_001667f0:
    pdVar18 = (double *)0x0;
LAB_001667f2:
    pdVar22 = (double *)0x0;
LAB_001667f4:
    pdVar25 = (double *)0x0;
LAB_001667f7:
    pdVar26 = (double *)0x0;
LAB_001667fa:
    IVar8 = lo[0];
    IVar7 = hi[0];
    if (icode_00 < 1) {
LAB_0016681d:
      pnga_error("sgai_norm1_block: wrong dimension",icode_00);
    }
    else {
      if (icode_00 == 1) {
        lVar15 = 1;
        lVar24 = 1;
      }
      else {
        lVar15 = hi[1];
        lVar24 = lo[1];
        if (icode_00 != 2) goto LAB_0016681d;
      }
      pdVar28 = local_3a8;
      if (0 < lVar15 && 0 < hi[0]) {
        local_3e8 = lVar24;
        switch(lVar10) {
        case 0:
          *(undefined4 *)pdVar26 = 0;
          lVar15 = lVar15 - local_3e8;
          iVar9 = 0;
          for (lVar10 = 0; lVar10 <= IVar7 - IVar8; lVar10 = lVar10 + 1) {
            piVar19 = (int *)pdVar16;
            for (lVar24 = 0; lVar24 <= lVar15; lVar24 = lVar24 + 1) {
              iVar3 = *piVar19;
              iVar27 = -iVar3;
              if (0 < iVar3) {
                iVar27 = iVar3;
              }
              iVar9 = iVar9 + iVar27;
              *(int *)pdVar26 = iVar9;
              piVar19 = piVar19 + IVar6;
            }
            pdVar16 = (double *)((long)pdVar16 + 4);
          }
          break;
        case 1:
          *pdVar25 = 0.0;
          lVar15 = lVar15 - local_3e8;
          dVar13 = 0.0;
          for (lVar10 = 0; lVar10 <= IVar7 - IVar8; lVar10 = lVar10 + 1) {
            plVar20 = (long *)pdVar16;
            for (lVar24 = 0; lVar24 <= lVar15; lVar24 = lVar24 + 1) {
              lVar12 = *plVar20;
              lVar23 = -lVar12;
              if (0 < lVar12) {
                lVar23 = lVar12;
              }
              dVar13 = (double)((long)dVar13 + lVar23);
              *pdVar25 = dVar13;
              plVar20 = plVar20 + IVar6;
            }
            pdVar16 = (double *)((long *)pdVar16 + 1);
          }
          break;
        case 2:
          *(undefined4 *)pdVar18 = 0;
          lVar15 = lVar15 - local_3e8;
          fVar32 = 0.0;
          for (lVar10 = 0; lVar10 <= IVar7 - IVar8; lVar10 = lVar10 + 1) {
            pfVar17 = (float *)pdVar16;
            for (lVar24 = 0; lVar24 <= lVar15; lVar24 = lVar24 + 1) {
              fVar1 = *pfVar17;
              uVar30 = -(uint)(fVar1 < -fVar1);
              fVar32 = fVar32 + (float)(~uVar30 & (uint)fVar1 | (uint)-fVar1 & uVar30);
              *(float *)pdVar18 = fVar32;
              pfVar17 = pfVar17 + IVar6;
            }
            pdVar16 = (double *)((long)pdVar16 + 4);
          }
          break;
        case 3:
          *pdVar22 = 0.0;
          lVar15 = lVar15 - local_3e8;
          dVar13 = 0.0;
          for (lVar10 = 0; lVar10 <= IVar7 - IVar8; lVar10 = lVar10 + 1) {
            pdVar11 = pdVar16;
            for (lVar24 = 0; lVar24 <= lVar15; lVar24 = lVar24 + 1) {
              dVar2 = *pdVar11;
              dVar4 = (double)((ulong)dVar2 ^ (ulong)DAT_001aa110);
              uVar31 = -(ulong)(dVar2 < dVar4);
              dVar13 = dVar13 + (double)(~uVar31 & (ulong)dVar2 | (ulong)dVar4 & uVar31);
              *pdVar22 = dVar13;
              pdVar11 = pdVar11 + IVar6;
            }
            pdVar16 = pdVar16 + 1;
          }
          break;
        default:
          pnga_error("sgai_norm1_block: wrong data type ",icode);
          break;
        case 5:
          *pdVar11 = 0.0;
          lVar15 = lVar15 - local_3e8;
          pfVar17 = (float *)((long)pdVar16 + 4);
          fVar32 = 0.0;
          for (lVar10 = 0; lVar10 <= IVar7 - IVar8; lVar10 = lVar10 + 1) {
            pfVar21 = pfVar17;
            for (lVar24 = 0; lVar24 <= lVar15; lVar24 = lVar24 + 1) {
              fVar32 = fVar32 + SQRT(pfVar21[-1] * pfVar21[-1] + *pfVar21 * *pfVar21);
              *(float *)pdVar11 = fVar32;
              pfVar21 = pfVar21 + IVar6 * 2;
            }
            pfVar17 = pfVar17 + 2;
          }
          break;
        case 6:
          lVar10 = hi[0] - lo[0];
          *pdVar14 = 0.0;
          pdVar14[1] = 0.0;
          pdVar16 = (double *)((long)pdVar16 + 8);
          dVar13 = 0.0;
          for (lVar12 = 0; lVar12 <= lVar10; lVar12 = lVar12 + 1) {
            pdVar11 = pdVar16;
            for (lVar23 = 0; lVar23 <= lVar15 - lVar24; lVar23 = lVar23 + 1) {
              dVar13 = dVar13 + SQRT(pdVar11[-1] * pdVar11[-1] + *pdVar11 * *pdVar11);
              *pdVar14 = dVar13;
              pdVar11 = pdVar11 + IVar6 * 2;
            }
            pdVar16 = pdVar16 + 2;
          }
        }
      }
    }
  }
  switch(type) {
  case 0x3e9:
    armci_msg_igop(&isum,1,"+");
    break;
  case 0x3ea:
    armci_msg_lgop(&lsum,1,"+");
    break;
  case 0x3eb:
    armci_msg_fgop(&fsum,1,"+");
    break;
  case 0x3ec:
    armci_msg_dgop(&dsum,1,"+");
    break;
  default:
    pnga_error("ga_norm1_: wrong data type ",type);
    break;
  case 0x3ee:
    dval = (double)CONCAT44(dval._4_4_,local_3d8[0]);
    armci_msg_fgop((float *)&dval,1,"+");
    local_3d8[0] = dval._0_4_;
    break;
  case 0x3ef:
    dval = local_3b8[0];
    armci_msg_dgop(&dval,1,"+");
    local_3b8[0] = dval;
  }
  switch(type) {
  case 0x3e9:
    dVar13 = (double)isum;
    break;
  case 0x3ea:
    dVar13 = (double)lsum;
    break;
  case 0x3eb:
    dVar13 = (double)fsum;
    break;
  case 0x3ec:
    dVar13 = dsum;
    break;
  default:
    pnga_error("ga_norm1_:wrong data type.",type);
    goto LAB_00166c17;
  case 0x3ee:
    dVar13 = (double)local_3d8[0];
    break;
  case 0x3ef:
    dVar13 = local_3b8[0];
  }
  *local_3f0 = dVar13;
LAB_00166c17:
  if (iVar5 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_norm1(Integer g_a, double *nm)
{
  Integer type=0;
  Integer me = pnga_nodeid (), i, j, nproc = pnga_nnodes();
  Integer ndim, dims[MAXDIM], lo[2], hi[2], ld; 
  Integer num_blocks_a;
  int local_sync_begin,local_sync_end;
  int isum = 0;
  long lsum = 0;
  double dsum = 0.0;
  float fsum = 0.0;
  double dval;
  float fval;
  DoubleComplex zsum;
  SingleComplex csum;
  char *buf = NULL;                    /*temporary buffer */
  char *ptr = NULL;
  zsum.real = 0.0;
  zsum.imag = 0.0;
  csum.real = 0.0;
  csum.imag = 0.0;
  _iterator_hdl hdl;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();

  pnga_check_handle (g_a, "ga_norm1_");

  pnga_inquire (g_a, &type, &ndim, dims);


  if(ndim<=0 || ndim > 2)
    pnga_error("ga_norm1: wrong dimension", ndim);

  switch (type)
  {
    case C_INT:
      buf = (void*)(&isum);
      break;
    case C_LONG:
      buf = (void*)(&lsum);
      break;
    case C_FLOAT:
      buf = (void*)(&fsum);
      break;
    case C_DBL:
      buf = (void*)(&dsum);
      break;
    case C_DCPL:
      buf = (void*)(&zsum);
      break;
    case C_SCPL:
      buf = (void*)(&csum);
      break;
    default:
      pnga_error("ga_norm1_: wrong data type:", type);
  }

#if 1
  pnga_local_iterator_init(g_a, &hdl);
  while (pnga_local_iterator_next(&hdl,lo,hi,&ptr,&ld)) {
    sgai_norm1_block(g_a, ptr, lo, hi, ld, type, ndim, dims, buf);
  }
#else
  num_blocks_a = pnga_total_blocks(g_a);

  if (num_blocks_a < 0) {
    pnga_distribution(g_a, me, lo, hi);
    pnga_access_ptr(g_a, lo, hi, &ptr, &ld);
    sgai_norm1_block(g_a, ptr, lo, hi, ld, type, ndim, dims, buf);
    pnga_release_update(g_a, lo, hi);
  } else {
    Integer idx;
    /* Simple block-cyclic data distribution */
    if (!pnga_uses_proc_grid(g_a)) {
      for (idx = me; idx < num_blocks_a; idx += nproc) {
        pnga_distribution(g_a, idx, lo, hi);
        pnga_access_block_ptr(g_a, idx, &ptr, &ld);
        sgai_norm1_block(g_a, ptr, lo, hi, ld, type, ndim, dims, buf);
        pnga_release_update_block(g_a, idx);
      }
    } else {
      /* Uses scalapack block-cyclic data distribution */
      Integer chk;
      Integer proc_index[MAXDIM], index[MAXDIM];
      Integer topology[MAXDIM];
      Integer blocks[MAXDIM], block_dims[MAXDIM];
      pnga_get_proc_index(g_a, me, proc_index);
      pnga_get_proc_index(g_a, me, index);
      pnga_get_block_info(g_a, blocks, block_dims);
      pnga_get_proc_grid(g_a, topology);
      while (index[ndim-1] < blocks[ndim-1]) {
        /* find bounding coordinates of block */
        chk = 1;
        for (i = 0; i < ndim; i++) {
          lo[i] = index[i]*block_dims[i]+1;
          hi[i] = (index[i] + 1)*block_dims[i];
          if (hi[i] > dims[i]) hi[i] = dims[i];
          if (hi[i] < lo[i]) chk = 0;
        }
        if (chk) {
          pnga_access_block_grid_ptr(g_a, index, &ptr, &ld);
          sgai_norm1_block(g_a, ptr, lo, hi, ld, type, ndim, dims, buf);
          pnga_release_update_block_grid(g_a, index);
        }
        /* increment index to get next block on processor */
        index[0] += topology[0];
        for (i = 0; i < ndim; i++) {
          if (index[i] >= blocks[i] && i<ndim-1) {
            index[i] = proc_index[i];
            index[i+1] += topology[i+1];
          }
        }
      }
    }
  }
#endif

  /*calculate the global value buf[j] for each column */
  switch (type)
  {
    case C_INT:
      armci_msg_igop (&isum, 1, "+");
      break;
    case C_DBL:
      armci_msg_dgop (&dsum, 1, "+");
      break;
    case C_DCPL:
      dval = zsum.real;
      armci_msg_dgop (&dval, 1, "+");
      zsum.real = dval;
      break;
    case C_FLOAT:
      armci_msg_fgop (&fsum, 1, "+");
      break;
    case C_SCPL:
      fval = csum.real;
      armci_msg_fgop (&fval, 1, "+");
      csum.real = fval;
      break;
    case C_LONG:
      armci_msg_lgop (&lsum, 1, "+");
      break;
    default:
      pnga_error("ga_norm1_: wrong data type ", type);
  }

  /*evaluate the norm1 for the matrix g_a */
  switch (type)
  {
    case C_INT:
      *nm = (double)isum;
      break;
    case C_LONG:
      *nm = (double)lsum;
      break;
    case C_FLOAT:
      *nm = (double)fsum;
      break;
    case C_DBL:
      *nm = (double)dsum;
      break;
    case C_DCPL:
      *nm = (double)(zsum.real);
      break;
    case C_SCPL:
      *nm = (double)(csum.real);
      break;
    default:
      pnga_error("ga_norm1_:wrong data type.", type);
  }

  if(local_sync_end)pnga_sync();
}